

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_endpoint_component_errors
          (dxt1_endpoint_optimizer *this,uint comp_index,uint64 (*error) [4] [256],
          uint64 (*best_remaining_error) [4])

{
  unique_color *puVar1;
  uchar *puVar2;
  uint64 uVar3;
  ulong uVar4;
  uint64 *puVar5;
  uint64 uVar6;
  ulong uVar7;
  long lVar8;
  uint64 (*pauVar9) [256];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint64 uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  ulong local_98 [6];
  uint64 WPP [4];
  uint64 WP2 [4];
  uint64 W [4];
  
  WPP[2] = 0;
  WPP[3] = 0;
  WPP[0] = 0;
  WPP[1] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  uVar10 = (ulong)(this->m_unique_colors).m_size;
  if (uVar10 != 0) {
    puVar1 = (this->m_unique_colors).m_p;
    puVar2 = (this->m_best_solution).m_selectors.m_p;
    uVar11 = 0;
    do {
      uVar12 = (ulong)puVar1[uVar11].m_color.field_0.c[comp_index];
      uVar7 = (ulong)puVar1[uVar11].m_weight;
      uVar4 = (ulong)puVar2[uVar11];
      WPP[uVar4 + 2] = WPP[uVar4 + 2] + uVar7;
      lVar8 = uVar7 * uVar12;
      local_98[uVar4 + 4] = local_98[uVar4 + 4] + lVar8 * 2;
      local_98[uVar4] = local_98[uVar4] + lVar8 * uVar12;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  bVar16 = comp_index == 1;
  pauVar9 = *error;
  lVar8 = 0;
  do {
    uVar6 = local_98[lVar8];
    (*error)[lVar8][0] = uVar6;
    uVar3 = WPP[lVar8 + 2];
    uVar10 = local_98[lVar8 + 4];
    lVar15 = 1;
    uVar14 = uVar6;
    do {
      uVar11 = (ulong)(byte)((byte)lVar15 >> bVar16 * '\x02' + 2 | (byte)lVar15 << (bVar16 ^ 3U));
      uVar11 = (uVar3 * uVar11 - uVar10) * uVar11 + uVar6;
      (*(uint64 (*) [256])*pauVar9)[lVar15] = uVar11;
      if (uVar14 <= uVar11) {
        uVar11 = uVar14;
      }
      lVar15 = lVar15 + 1;
      uVar14 = uVar11;
    } while ((ulong)bVar16 * 0x20 + 0x20 != lVar15);
    (*best_remaining_error)[lVar8] = uVar11;
    pauVar9 = pauVar9 + 1;
    bVar17 = lVar8 == 0;
    lVar8 = lVar8 + 1;
  } while (bVar17);
  puVar5 = (*error)[2] + 1;
  lVar8 = 2;
  do {
    uVar6 = local_98[lVar8];
    (*error)[lVar8][0] = uVar6;
    uVar3 = WPP[lVar8 + 2];
    uVar10 = (uVar3 - local_98[lVar8 + 4]) + uVar6;
    lVar15 = uVar3 * 3 - local_98[lVar8 + 4];
    lVar13 = 0;
    do {
      puVar5[lVar13] = uVar10;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      uVar10 = uVar10 + lVar15;
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + uVar3 * 2;
    } while (lVar13 != 0xff);
    (*best_remaining_error)[lVar8] = uVar6;
    lVar8 = lVar8 + 1;
    puVar5 = puVar5 + 0x100;
  } while (lVar8 != 4);
  uVar6 = (*best_remaining_error)[3];
  lVar8 = 2;
  do {
    uVar6 = uVar6 + (*best_remaining_error)[lVar8];
    (*best_remaining_error)[lVar8] = uVar6;
    bVar16 = lVar8 != 0;
    lVar8 = lVar8 + -1;
  } while (bVar16);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_endpoint_component_errors(uint comp_index, uint64 (&error)[4][256], uint64 (&best_remaining_error)[4])
    {
        uint64 W[4] = {}, WP2[4] = {}, WPP[4] = {};
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            uint p = m_unique_colors[i].m_color[comp_index];
            uint w = m_unique_colors[i].m_weight;
            uint8 s = m_best_solution.m_selectors[i];
            W[s] += (int64)w;
            WP2[s] += (int64)w * p * 2;
            WPP[s] += (int64)w * p * p;
        }
        const uint comp_limit = comp_index == 1 ? 64 : 32;
        for (uint8 s = 0; s < 2; s++)
        {
            uint64 best_error = error[s][0] = WPP[s];
            for (uint8 c = 1; c < comp_limit; c++)
            {
                uint8 p = comp_index == 1 ? c << 2 | c >> 4 : c << 3 | c >> 2;
                error[s][c] = W[s] * p * p - WP2[s] * p + WPP[s];
                if (error[s][c] < best_error)
                {
                    best_error = error[s][c];
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 2; s < 4; s++)
        {
            uint64 best_error = error[s][0] = WPP[s], d = W[s] - WP2[s], dd = W[s] << 1, e = WPP[s] + d;
            for (uint p = 1; p < 256; p++, d += dd, e += d)
            {
                error[s][p] = e;
                if (e < best_error)
                {
                    best_error = e;
                }
            }
            best_remaining_error[s] = best_error;
        }
        for (uint8 s = 3; s; s--)
        {
            best_remaining_error[s - 1] += best_remaining_error[s];
        }
    }